

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

QByteArrayView __thiscall
QHttpHeaders::value(QHttpHeaders *this,WellKnownHeader name,QByteArrayView defaultValue)

{
  QHttpHeadersPrivate *this_00;
  long in_FS_OFFSET;
  _Variadic_union<QHttpHeaders::WellKnownHeader,_QByteArray> local_40;
  undefined1 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if ((this_00 != (QHttpHeadersPrivate *)0x0) && ((this_00->headers).d.size != 0)) {
    local_28 = 0;
    local_40._M_first._M_storage = (_Uninitialized<QHttpHeaders::WellKnownHeader,_true>)name;
    defaultValue = QHttpHeadersPrivate::value(this_00,(HeaderName *)&local_40._M_first,defaultValue)
    ;
    std::__detail::__variant::_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray>::
    _M_reset((_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)
             &local_40._M_first);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return defaultValue;
  }
  __stack_chk_fail();
}

Assistant:

const noexcept
{
    if (isEmpty())
        return defaultValue;

    return d->value(HeaderName{name}, defaultValue);
}